

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

void __thiscall soinn::ESOINN::deleteOldEdges(ESOINN *this)

{
  edge_descriptor e;
  edge_desc_impl<boost::undirected_tag,_void_*> e_00;
  type_conflict1 tVar1;
  edge_bundled *peVar2;
  reference local_c0;
  reference local_a8;
  void *local_90;
  Vertex vertexT;
  void *local_70;
  Vertex vertexS;
  void *local_60;
  property_type *local_58;
  iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  local_50;
  iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  local_48 [8];
  EdgeIterator next;
  pair<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>_>
  local_30;
  undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  local_20;
  EdgeIterator end;
  EdgeIterator current;
  ESOINN *this_local;
  
  boost::detail::
  undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  ::undirected_edge_iter(&end);
  boost::detail::
  undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  ::undirected_edge_iter(&local_20);
  local_30 = boost::
             edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>
                       ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>
                         *)&this->graph);
  boost::tuples::
  tie<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>>
            ((tuples *)&next,&end,&local_20);
  boost::tuples::
  tuple<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>&,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>&,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&next,&local_30);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                             *)&end,(iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                                     *)&local_20), tVar1) {
    local_50.m_iterator._M_node =
         (_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>)
         boost::iterators::operator++(local_48,0);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator*((reference *)&vertexS,
                (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                 *)&end);
    e.super_edge_base<boost::undirected_tag,_void_*>.m_target = local_60;
    e.super_edge_base<boost::undirected_tag,_void_*>.m_source = vertexS;
    e.m_eproperty = local_58;
    peVar2 = boost::
             adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
             ::operator[](&this->graph,e);
    if (this->ageMax < peVar2->age) {
      boost::iterators::detail::
      iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
      ::operator*((reference *)&vertexT,
                  (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                   *)&end);
      local_70 = boost::
                 source<boost::undirected_tag,void*,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>
                           ((edge_base<boost::undirected_tag,_void_*> *)&vertexT,&this->graph);
      boost::iterators::detail::
      iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
      ::operator*(&local_a8,
                  (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                   *)&end);
      local_90 = boost::
                 target<boost::undirected_tag,void*,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>
                           (&local_a8.super_edge_base<boost::undirected_tag,_void_*>,&this->graph);
      boost::iterators::detail::
      iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
      ::operator*(&local_c0,
                  (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                   *)&end);
      e_00.super_edge_base<boost::undirected_tag,_void_*>.m_target =
           local_c0.super_edge_base<boost::undirected_tag,_void_*>.m_target;
      e_00.super_edge_base<boost::undirected_tag,_void_*>.m_source =
           local_c0.super_edge_base<boost::undirected_tag,_void_*>.m_source;
      e_00.m_eproperty = local_c0.m_eproperty;
      boost::
      remove_edge<boost::detail::edge_desc_impl<boost::undirected_tag,void*>,boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>
                (e_00,(undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>
                       *)&this->graph);
    }
  }
  return;
}

Assistant:

void ESOINN::deleteOldEdges()
{
    EdgeIterator current, end;
    boost::tie(current, end) = boost::edges(graph);
    EdgeIterator next = current;
    for(;current != end; current = next)
    {
        next ++;
        if(graph[*current].age > ageMax)
        {
            Vertex vertexS = boost::source(*current, graph);
            Vertex vertexT = boost::target(*current, graph);
            boost::remove_edge(*current, graph);
        }
    }
}